

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeUtilsTest.cpp
# Opt level: O2

void __thiscall TimeUtilsTest::Run(TimeUtilsTest *this)

{
  int iVar1;
  
  iVar1 = this->mTest;
  if ((iVar1 == 3) || (iVar1 == 2)) {
    test2(this);
  }
  else if (iVar1 == 1) {
    test1(this);
  }
  TestCase::TestPassed(&this->super_TestCase);
  return;
}

Assistant:

void TimeUtilsTest::Run()
{	
	LOG_NOTICE( "UDP Test Started" );

	switch ( mTest )
	{
		case 1:
			test1();
			break;
		case 2:
			test2();
			break;
		case 3:
			test2();
			break;
	}
	
	TestPassed();
}